

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda.c
# Opt level: O3

int32 feat_read_lda(feat_t *feat,char *ldafile,int32 dim)

{
  int32 iVar1;
  int iVar2;
  FILE *__stream;
  uint32 uVar3;
  uint uVar4;
  char **argname_00;
  char *pcVar5;
  ulong uVar6;
  char **argval;
  char **argname;
  uint local_5c;
  uint32 n;
  uint32 m;
  uint32 chksum;
  int32 byteswap;
  char *local_48;
  FILE *local_40;
  void ***outlda;
  
  if (feat == (feat_t *)0x0) {
    __assert_fail("feat",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/lda.c"
                  ,0x45,"int32 feat_read_lda(feat_t *, const char *, int32)");
  }
  if (feat->n_stream == 1) {
    __stream = fopen(ldafile,"rb");
    if (__stream == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/lda.c"
                     ,0x4d,"Failed to open transform file \'%s\' for reading",ldafile);
    }
    else {
      iVar1 = bio_readhdr((FILE *)__stream,&argname,&argval,&byteswap);
      if (iVar1 < 0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/lda.c"
                ,0x52,"Failed to read header from transform file \'%s\'\n",ldafile);
      }
      else {
        pcVar5 = *argname;
        argname_00 = argname;
        local_5c = dim;
        local_48 = ldafile;
        local_40 = __stream;
        if (pcVar5 != (char *)0x0) {
          uVar4 = 1;
          uVar6 = 0;
          do {
            iVar2 = strcmp(pcVar5,"version");
            if (iVar2 == 0) {
              pcVar5 = argval[uVar6];
              iVar2 = strcmp(pcVar5,"0.1");
              if (iVar2 != 0) {
                err_msg(ERR_WARN,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/lda.c"
                        ,0x5b,"%s: Version mismatch: %s, expecting %s\n",local_48,pcVar5,"0.1");
                argname_00 = argname;
              }
            }
            uVar6 = (ulong)uVar4;
            pcVar5 = argname_00[uVar6];
            uVar4 = uVar4 + 1;
          } while (pcVar5 != (char *)0x0);
        }
        bio_hdrarg_free(argname_00,argval);
        pcVar5 = local_48;
        argval = (char **)0x0;
        argname = (char **)0x0;
        chksum = 0;
        if (feat->lda != (mfcc_t ***)0x0) {
          ckd_free_3d(feat->lda);
        }
        __stream = local_40;
        iVar1 = bio_fread_3d(&outlda,4,&feat->n_lda,&m,&n,(FILE *)local_40,byteswap,&chksum);
        uVar4 = local_5c;
        if (-1 < iVar1) {
          feat->lda = (mfcc_t ***)outlda;
          fclose(__stream);
          if (n == *feat->stream_len) {
            uVar3 = uVar4;
            if (m < uVar4) {
              uVar3 = m;
            }
            if ((int)uVar4 < 1) {
              uVar3 = m;
            }
            feat->out_dim = uVar3;
            return 0;
          }
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/lda.c"
                  ,0x80,"LDA matrix dimension %d doesn\'t match feature stream size %d\n");
          exit(1);
        }
        err_msg_system(ERR_ERROR,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/lda.c"
                       ,0x6e,"%s: bio_fread_3d(lda) failed\n",pcVar5);
      }
      fclose(__stream);
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/feat/lda.c"
            ,0x48,"LDA incompatible with multi-stream features (n_stream = %d)\n");
  }
  return -1;
}

Assistant:

int32
feat_read_lda(feat_t *feat, const char *ldafile, int32 dim)
{
    FILE *fh;
    int32 byteswap;
    uint32 chksum, i, m, n;
    char **argname, **argval;

    assert(feat);
    if (feat->n_stream != 1) {
        E_ERROR("LDA incompatible with multi-stream features (n_stream = %d)\n",
                feat->n_stream);
        return -1;
    }

    if ((fh = fopen(ldafile, "rb")) == NULL) {
        E_ERROR_SYSTEM("Failed to open transform file '%s' for reading", ldafile);
        return -1;
    }

    if (bio_readhdr(fh, &argname, &argval, &byteswap) < 0) {
        E_ERROR("Failed to read header from transform file '%s'\n", ldafile);
        fclose(fh);
        return -1;
    }

    for (i = 0; argname[i]; i++) {
        if (strcmp(argname[i], "version") == 0) {
            if (strcmp(argval[i], MATRIX_FILE_VERSION) != 0)
                E_WARN("%s: Version mismatch: %s, expecting %s\n",
                       ldafile, argval[i], MATRIX_FILE_VERSION);
        }
    }

    bio_hdrarg_free(argname, argval);
    argname = argval = NULL;

    chksum = 0;

    if (feat->lda)
        ckd_free_3d((void ***)feat->lda);

    {
        /* Use a temporary variable to avoid strict-aliasing problems. */
        void ***outlda;

        if (bio_fread_3d(&outlda, sizeof(float32),
                         &feat->n_lda, &m, &n,
                         fh, byteswap, &chksum) < 0) {
            E_ERROR_SYSTEM("%s: bio_fread_3d(lda) failed\n", ldafile);
            fclose(fh);
            return -1;
        }
        feat->lda = (void *)outlda;
    }
    fclose(fh);
    
#ifdef FIXED_POINT
    /* FIXME: This is a fragile hack that depends on mfcc_t and
     * float32 being the same size (which they are, but...) */
    for (i = 0; i < feat->n_lda * m * n; ++i) {
        feat->lda[0][0][i] = FLOAT2MFCC(((float *)feat->lda[0][0])[i]);
    }
#endif

    /* Note that SphinxTrain stores the eigenvectors as row vectors. */
    if (n != feat->stream_len[0])
	E_FATAL("LDA matrix dimension %d doesn't match feature stream size %d\n", n, feat->stream_len[0]);
    
    /* Override dim from file if it is 0 or greater than m. */
    if ((uint32)dim > m || dim <= 0) {
        dim = m;
    }
    feat->out_dim = dim;

    return 0;
}